

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swapproc.c
# Opt level: O1

void ffswap2(short *svalues,long nvals)

{
  ushort *puVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  if (((ulong)svalues & 1) == 0) {
    uVar2 = (ulong)(0x10 - ((uint)svalues & 0xe) >> 1);
    if (((ulong)svalues & 0xe) == 0) {
      uVar2 = 0;
    }
    if ((ulong)nvals <= uVar2) {
      uVar2 = nvals;
    }
    if (uVar2 != 0) {
      uVar4 = 0;
      do {
        puVar1 = (ushort *)(svalues + uVar4);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
    uVar4 = nvals - uVar2;
    for (; uVar2 < (uVar4 & 0xfffffffffffffff8); uVar2 = uVar2 + 8) {
      auVar5 = *(undefined1 (*) [16])(svalues + uVar2);
      auVar6._0_2_ = auVar5._0_2_ >> 8;
      auVar6._2_2_ = auVar5._2_2_ >> 8;
      auVar6._4_2_ = auVar5._4_2_ >> 8;
      auVar6._6_2_ = auVar5._6_2_ >> 8;
      auVar6._8_2_ = auVar5._8_2_ >> 8;
      auVar6._10_2_ = auVar5._10_2_ >> 8;
      auVar6._12_2_ = auVar5._12_2_ >> 8;
      auVar6._14_2_ = auVar5._14_2_ >> 8;
      auVar5 = psllw(auVar5,8);
      *(undefined1 (*) [16])(svalues + uVar2) = auVar5 | auVar6;
    }
    if ((long)uVar2 < nvals) {
      do {
        puVar1 = (ushort *)(svalues + uVar2);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        uVar2 = uVar2 + 1;
      } while (nvals != uVar2);
    }
  }
  else if (0 < nvals) {
    lVar3 = 0;
    do {
      puVar1 = (ushort *)(svalues + lVar3);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      lVar3 = lVar3 + 1;
    } while (nvals != lVar3);
  }
  return;
}

Assistant:

void ffswap2(short *svalues,  /* IO - pointer to shorts to be swapped    */
             long nvals)     /* I  - number of shorts to be swapped     */
/*
  swap the bytes in the input short integers: ( 0 1 -> 1 0 )
*/
{
    if ((long)svalues % 2 != 0) { /* should not happen */
        ffswap2_slow(svalues, nvals);
        return;
    }

    long ii;
    size_t peel = get_peel((void*)&svalues[0], sizeof(svalues[0]), nvals, 16);

    ffswap2_slow(svalues, peel);
    for (ii = peel; ii < (nvals - peel - (nvals - peel) % 8); ii+=8) {
        swap2_sse2((char*)&svalues[ii]);
    }
    ffswap2_slow(&svalues[ii], nvals - ii);
}